

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodeSetPtr xmlXPathNodeSetMergeAndClear(xmlNodeSetPtr set1,xmlNodeSetPtr set2)

{
  int iVar1;
  xmlNodePtr ns;
  xmlNodePtr pxVar2;
  int iVar3;
  xmlNodePtr n2;
  xmlNodePtr n1;
  int local_28;
  int initNbSet1;
  int j;
  int i;
  xmlNodeSetPtr set2_local;
  xmlNodeSetPtr set1_local;
  
  iVar1 = set1->nodeNr;
  initNbSet1 = 0;
  do {
    if (set2->nodeNr <= initNbSet1) {
      set2->nodeNr = 0;
      return set1;
    }
    ns = set2->nodeTab[initNbSet1];
    for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
      pxVar2 = set1->nodeTab[local_28];
      if (pxVar2 == ns) goto LAB_00238767;
      if ((((pxVar2->type == XML_NAMESPACE_DECL) && (ns->type == XML_NAMESPACE_DECL)) &&
          ((_xmlNs *)pxVar2->_private == (_xmlNs *)ns->_private)) &&
         (iVar3 = xmlStrEqual((xmlChar *)pxVar2->children,(xmlChar *)ns->children), iVar3 != 0)) {
        xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
        goto LAB_00238767;
      }
    }
    if ((set1->nodeMax <= set1->nodeNr) && (iVar3 = xmlXPathNodeSetGrow(set1), iVar3 < 0)) {
      xmlXPathFreeNodeSet(set1);
      xmlXPathNodeSetClear(set2,1);
      return (xmlNodeSetPtr)0x0;
    }
    iVar3 = set1->nodeNr;
    set1->nodeNr = iVar3 + 1;
    set1->nodeTab[iVar3] = ns;
LAB_00238767:
    set2->nodeTab[initNbSet1] = (xmlNodePtr)0x0;
    initNbSet1 = initNbSet1 + 1;
  } while( true );
}

Assistant:

static xmlNodeSetPtr
xmlXPathNodeSetMergeAndClear(xmlNodeSetPtr set1, xmlNodeSetPtr set2)
{
    {
	int i, j, initNbSet1;
	xmlNodePtr n1, n2;

	initNbSet1 = set1->nodeNr;
	for (i = 0;i < set2->nodeNr;i++) {
	    n2 = set2->nodeTab[i];
	    /*
	    * Skip duplicates.
	    */
	    for (j = 0; j < initNbSet1; j++) {
		n1 = set1->nodeTab[j];
		if (n1 == n2) {
		    goto skip_node;
		} else if ((n1->type == XML_NAMESPACE_DECL) &&
		    (n2->type == XML_NAMESPACE_DECL))
		{
		    if ((((xmlNsPtr) n1)->next == ((xmlNsPtr) n2)->next) &&
			(xmlStrEqual(((xmlNsPtr) n1)->prefix,
			((xmlNsPtr) n2)->prefix)))
		    {
			/*
			* Free the namespace node.
			*/
			xmlXPathNodeSetFreeNs((xmlNsPtr) n2);
			goto skip_node;
		    }
		}
	    }
	    /*
	    * grow the nodeTab if needed
	    */
            if (set1->nodeNr >= set1->nodeMax) {
                if (xmlXPathNodeSetGrow(set1) < 0)
                    goto error;
            }
	    set1->nodeTab[set1->nodeNr++] = n2;
skip_node:
            set2->nodeTab[i] = NULL;
	}
    }
    set2->nodeNr = 0;
    return(set1);

error:
    xmlXPathFreeNodeSet(set1);
    xmlXPathNodeSetClear(set2, 1);
    return(NULL);
}